

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setShortcut(QAction *this,QKeySequence *shortcut)

{
  initializer_list<QKeySequence> args;
  bool bVar1;
  QKeySequence *in_RSI;
  QList<QKeySequence> *in_RDI;
  long in_FS_OFFSET;
  QKeySequence *in_stack_ffffffffffffff98;
  QKeySequence *pQVar2;
  QKeySequence *in_stack_ffffffffffffffa0;
  QKeySequence *this_00;
  QList<QKeySequence> *in_stack_ffffffffffffffa8;
  QAction *this_01;
  undefined1 local_10 [8];
  QKeySequence local_8;
  
  local_8.d = *(QKeySequencePrivate **)(in_FS_OFFSET + 0x28);
  bVar1 = QKeySequence::isEmpty(in_RSI);
  if (bVar1) {
    setShortcuts((QAction *)in_stack_ffffffffffffffa8,
                 (StandardKey)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  else {
    QKeySequence::QKeySequence(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    this_01 = (QAction *)local_10;
    args._M_len = (size_type)this_01;
    args._M_array = (iterator)in_RDI;
    QList<QKeySequence>::QList(in_stack_ffffffffffffffa8,args);
    setShortcuts(this_01,in_RDI);
    QList<QKeySequence>::~QList((QList<QKeySequence> *)0x97554a);
    this_00 = (QKeySequence *)local_10;
    pQVar2 = &local_8;
    do {
      pQVar2 = pQVar2 + -1;
      QKeySequence::~QKeySequence(this_00);
    } while (pQVar2 != this_00);
  }
  if (*(QKeySequencePrivate **)(in_FS_OFFSET + 0x28) != local_8.d) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAction::setShortcut(const QKeySequence &shortcut)
{
    if (shortcut.isEmpty())
        setShortcuts({});
    else
        setShortcuts({ shortcut });
}